

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O1

int pcap_loop(pcap_t *p,int cnt,pcap_handler callback,u_char *user)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  while( true ) {
    if (p->rfile == (FILE *)0x0) {
      do {
        iVar2 = (*p->read_op)(p,cnt,callback,user);
      } while (iVar2 == 0);
    }
    else {
      iVar2 = pcap_offline_read(p,cnt,callback,user);
    }
    if (iVar2 < 1) break;
    if ((0 < cnt) && (iVar3 = cnt - iVar2, bVar1 = cnt < iVar2, cnt = iVar3, iVar3 == 0 || bVar1)) {
      return 0;
    }
  }
  return iVar2;
}

Assistant:

int
pcap_loop(pcap_t *p, int cnt, pcap_handler callback, u_char *user)
{
	register int n;

	for (;;) {
		if (p->rfile != NULL) {
			/*
			 * 0 means EOF, so don't loop if we get 0.
			 */
			n = pcap_offline_read(p, cnt, callback, user);
		} else {
			/*
			 * XXX keep reading until we get something
			 * (or an error occurs)
			 */
			do {
				n = p->read_op(p, cnt, callback, user);
			} while (n == 0);
		}
		if (n <= 0)
			return (n);
		if (!PACKET_COUNT_IS_UNLIMITED(cnt)) {
			cnt -= n;
			if (cnt <= 0)
				return (0);
		}
	}
}